

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Int_t * Gia_ObjSimCands(Gia_SimRsbMan_t *p,int iObj,int nCands)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *p_00;
  int i;
  int iVar4;
  
  if (iObj < 1) {
    __assert_fail("iObj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x239,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  pGVar2 = Gia_ManObj(p->pGia,iObj);
  if (((int)(uint)*(undefined8 *)pGVar2 < 0) ||
     (((uint)*(undefined8 *)pGVar2 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x23a,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
  }
  p->vCands->nSize = 0;
  Vec_IntFill(p->vFanins,1,iObj);
  p_00 = p->vFanins;
  while( true ) {
    iVar1 = p_00->nSize;
    if (iVar1 < 1) break;
    pVVar3 = p->vCands;
    iVar4 = pVVar3->nSize;
    if (nCands <= iVar4) goto LAB_006316d3;
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      iVar1 = Vec_IntEntry(p_00,iVar4);
      Gia_ObjSetTravIdCurrentId(p->pGia,iVar1);
      p_00 = p->vFanins;
      iVar1 = p_00->nSize;
    }
    Gia_ObjSimCollect(p);
    Vec_IntAppend(p->vCands,p->vFanins2);
    pVVar3 = p->vFanins;
    p_00 = p->vFanins2;
    p->vFanins = p_00;
    p->vFanins2 = pVVar3;
  }
  pVVar3 = p->vCands;
  iVar4 = pVVar3->nSize;
  if (iVar1 != 0) {
LAB_006316d3:
    if (iVar4 < nCands) {
      __assert_fail("Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                    ,0x246,"Vec_Int_t *Gia_ObjSimCands(Gia_SimRsbMan_t *, int, int)");
    }
  }
  if (nCands < iVar4) {
    Vec_IntShrink(pVVar3,nCands);
    pVVar3 = p->vCands;
  }
  return pVVar3;
}

Assistant:

Vec_Int_t * Gia_ObjSimCands( Gia_SimRsbMan_t * p, int iObj, int nCands )
{
    assert( iObj > 0 );
    assert( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iObj)) );
    Vec_IntClear( p->vCands );
    Vec_IntFill( p->vFanins, 1, iObj );
    while ( Vec_IntSize(p->vFanins) > 0 && Vec_IntSize(p->vCands) < nCands )
    {
        int i, iTemp;
        Vec_IntForEachEntry( p->vFanins, iTemp, i )
            Gia_ObjSetTravIdCurrentId( p->pGia, iTemp );
        Gia_ObjSimCollect( p ); // p->vFanins -> p->vFanins2
        Vec_IntAppend( p->vCands, p->vFanins2 );
        ABC_SWAP( Vec_Int_t *, p->vFanins, p->vFanins2 );
    }
    assert( Vec_IntSize(p->vFanins) == 0 || Vec_IntSize(p->vCands) >= nCands );
    if ( Vec_IntSize(p->vCands) > nCands )
        Vec_IntShrink( p->vCands, nCands );
    return p->vCands;
}